

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<96,unsigned_int>
               (hashfunc<unsigned_int> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  size_type sVar2;
  undefined4 in_ECX;
  uint in_EDX;
  char *pcVar3;
  uint in_ESI;
  int in_R8D;
  byte in_R9B;
  bool result;
  uint h;
  keytype k;
  vector<unsigned_int,_std::allocator<unsigned_int>_> hashes;
  bool in_stack_0000008b;
  bool in_stack_0000008c;
  bool in_stack_0000008d;
  bool in_stack_0000008e;
  bool in_stack_0000008f;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000090;
  uint32_t *in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa2;
  byte bVar4;
  undefined1 in_stack_ffffffffffffffa3;
  undefined3 uVar5;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 uVar6;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  pfHash in_stack_ffffffffffffffc0;
  Blob<96> local_34;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = (byte)in_EDX & 1;
  local_e = (byte)in_ECX & 1;
  local_f = (byte)in_R8D & 1;
  local_10 = in_R9B & 1;
  pcVar3 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar3 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x60,pcVar3,(ulong)in_ESI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x128eb1);
  Blob<96>::Blob(&local_34);
  memset(&local_34,0,0xc);
  if ((local_d & 1) != 0) {
    hashfunc<unsigned_int>::operator()
              ((hashfunc<unsigned_int> *)CONCAT44(in_stack_ffffffffffffffb4,in_ESI),
               (void *)CONCAT44(in_EDX,in_ECX),in_R8D,
               CONCAT13(in_stack_ffffffffffffffa3,
                        CONCAT12(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0)),
               in_stack_ffffffffffffff98);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_ESI),
               (value_type_conflict1 *)CONCAT44(in_EDX,in_ECX));
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<96>,unsigned_int>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
             SUB41((uint)in_stack_ffffffffffffffb4 >> 0x18,0),(Blob<96> *)CONCAT44(in_EDX,in_ECX),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_R8D,CONCAT13(in_stack_ffffffffffffffa3,
                                      CONCAT12(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0))
                     ));
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_28);
  printf("%d keys\n",sVar2 & 0xffffffff);
  uVar5 = (undefined3)in_stack_ffffffffffffffb4;
  bVar4 = 1;
  bVar1 = TestHashList<unsigned_int>
                    (in_stack_00000090,in_stack_0000008f,in_stack_0000008e,in_stack_0000008d,
                     in_stack_0000008c,in_stack_0000008b);
  uVar6 = CONCAT13(bVar1 & bVar4,uVar5);
  printf("\n");
  bVar4 = (byte)((uint)uVar6 >> 0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(uVar6,in_ESI));
  return (bool)(bVar4 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}